

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O0

double __thiscall ON_EdgeSoftening::EdgeAngleThreshold(ON_EdgeSoftening *this)

{
  ON_InternalXMLImpl *this_00;
  double dVar1;
  ON_XMLVariant local_200;
  ON_XMLVariant local_108;
  ON_EdgeSoftening *local_10;
  ON_EdgeSoftening *this_local;
  
  this_00 = &((this->super_ON_MeshModifier).m_impl)->super_ON_InternalXMLImpl;
  local_10 = this;
  ::ON_XMLVariant::ON_XMLVariant(&local_200,5.0);
  ON_InternalXMLImpl::GetParameter(&local_108,this_00,L"edge-threshold",&local_200);
  dVar1 = ::ON_XMLVariant::AsDouble(&local_108);
  ::ON_XMLVariant::~ON_XMLVariant(&local_108);
  ::ON_XMLVariant::~ON_XMLVariant(&local_200);
  return dVar1;
}

Assistant:

double ON_EdgeSoftening::EdgeAngleThreshold(void) const
{
  return m_impl->GetParameter(ON_EDGE_SOFTENING_EDGE_THRESHOLD, 5.0).AsDouble();
}